

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void ga_pose_compose(ga_pose *x1,ga_pose *x2,ga_pose *r)

{
  ga_pose *r_local;
  ga_pose *x2_local;
  ga_pose *x1_local;
  
  if (x1 == (ga_pose *)0x0) {
    __assert_fail("x1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x29,
                  "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
                 );
  }
  if (x2 == (ga_pose *)0x0) {
    __assert_fail("x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x2a,
                  "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
                 );
  }
  if (r == (ga_pose *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x2b,
                  "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
                 );
  }
  if (x1 != r) {
    if (x2 == r) {
      __assert_fail("x2 != r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x2d,
                    "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
                   );
    }
    if (x1->reference_frame == x2->target_frame) {
      r->target_body = x1->target_body;
      r->target_frame = x1->target_frame;
      r->reference_body = x2->reference_body;
      r->reference_frame = x2->reference_frame;
      return;
    }
    __assert_fail("x1->reference_frame == x2->target_frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x2e,
                  "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
                 );
  }
  __assert_fail("x1 != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x2c,
                "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
               );
}

Assistant:

void ga_pose_compose(
        const struct ga_pose *x1,
        const struct ga_pose *x2,
        struct ga_pose *r)
{
    assert(x1);
    assert(x2);
    assert(r);
    assert(x1 != r);
    assert(x2 != r);
    assert(x1->reference_frame == x2->target_frame);

    r->target_body = x1->target_body;
    r->target_frame = x1->target_frame;
    r->reference_body = x2->reference_body;
    r->reference_frame = x2->reference_frame;
}